

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

long __thiscall
duckdb::Interpolator<true>::Interpolate<unsigned_long,long,duckdb::QuantileIndirect<long>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<long> *accessor)

{
  RESULT_TYPE_conflict2 input;
  long lVar1;
  unsigned_long local_8;
  
  local_8 = lidx;
  input = QuantileIndirect<long>::operator()(accessor,&local_8);
  lVar1 = Cast::Operation<long,long>(input);
  return lVar1;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}